

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::pair_range_esc
          (basic_substring<const_char> *this,CC open_close,CC escape)

{
  basic_substring<const_char> bVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  error_flags eVar5;
  char in_DL;
  char in_SIL;
  long *in_RDI;
  CC c;
  size_t i;
  size_t b;
  char in_stack_ffffffffffffff4f;
  basic_substring<const_char> *in_stack_ffffffffffffff50;
  long *s_;
  undefined7 in_stack_ffffffffffffff70;
  char cVar6;
  ulong local_88;
  basic_substring<const_char> local_68;
  char *local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  ulong local_28;
  size_t local_20;
  char *local_10;
  size_t local_8;
  
  local_20 = find(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f,0x362a61);
  sVar3 = local_20;
  if (local_20 == 0xffffffffffffffff) {
    basic_substring(&local_68);
  }
  else {
    do {
      sVar2 = sVar3;
      local_88 = sVar2 + 1;
      if ((ulong)in_RDI[1] <= local_88) {
        basic_substring(&local_68);
        goto LAB_00362d3d;
      }
      cVar6 = *(char *)(*in_RDI + local_88);
      sVar3 = local_88;
    } while ((cVar6 != in_SIL) || (sVar3 = local_88, *(char *)(*in_RDI + sVar2) == in_DL));
    local_28 = sVar2 + 2;
    s_ = in_RDI;
    if ((ulong)in_RDI[1] < local_20) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      local_38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_30 = 0x1544;
      handle_error(0x389522,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
    }
    if (local_28 == 0xffffffffffffffff) {
      local_28 = in_RDI[1];
    }
    if (local_28 < local_20) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      local_48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_40 = 0x1546;
      handle_error(0x389522,(char *)0x1546,"check failed: %s","first <= last");
    }
    if ((ulong)in_RDI[1] < local_28) {
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      local_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_50 = 0x1547;
      handle_error(0x389522,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
    }
    basic_substring((basic_substring<const_char> *)CONCAT17(cVar6,in_stack_ffffffffffffff70),
                    (char *)s_,(size_t)in_RDI);
    local_68.str = local_10;
    local_68.len = local_8;
  }
LAB_00362d3d:
  bVar1.len = local_68.len;
  bVar1.str = local_68.str;
  return bVar1;
}

Assistant:

basic_substring pair_range_esc(CC open_close, CC escape=CC('\\'))
    {
        size_t b = find(open_close);
        if(b == npos) return basic_substring();
        for(size_t i = b+1; i < len; ++i)
        {
            CC c = str[i];
            if(c == open_close)
            {
                if(str[i-1] != escape)
                {
                    return range(b, i+1);
                }
            }
        }
        return basic_substring();
    }